

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

bool Cipher::encryptExact(TParameters *param_1,string *text,TClusters *clusters)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  pointer pcVar4;
  size_type sVar5;
  pointer piVar6;
  int iVar7;
  ulong uVar8;
  size_type sVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  string *__range2;
  vector<int,_std::allocator<int>_> alphabetTransformation;
  _Vector_base<int,_std::allocator<int>_> local_448;
  array<int,_256UL> myCharToLetter;
  
  memcpy(&myCharToLetter,(anonymous_namespace)::kCharToLetter,0x400);
  pcVar4 = (text->_M_dataplus)._M_p;
  sVar5 = text->_M_string_length;
  uVar11 = 0x1b;
  for (sVar9 = 0; sVar5 != sVar9; sVar9 = sVar9 + 1) {
    cVar1 = pcVar4[sVar9];
    if (myCharToLetter._M_elems[cVar1] == 0) {
      uVar11 = uVar11 + 1;
      myCharToLetter._M_elems[cVar1] = uVar11;
    }
  }
  uVar12 = 0;
  printf("[encryptExact] Unique symbols = %d\n",(ulong)uVar11);
  std::vector<int,_std::allocator<int>_>::vector
            (&alphabetTransformation,(long)(int)uVar11,(allocator_type *)&local_448);
  uVar8 = (ulong)((long)alphabetTransformation.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                 (long)alphabetTransformation.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar10 = 0;
  if (0 < (int)uVar8) {
    uVar10 = uVar8 & 0xffffffff;
  }
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    alphabetTransformation.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar12] = (int)uVar12;
  }
  local_448._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar8 = uVar8 & 0xffffffff; 1 < (int)uVar8; uVar8 = uVar8 - 1) {
    iVar7 = rand();
    iVar7 = iVar7 % (int)uVar8;
    iVar2 = alphabetTransformation.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8 - 1];
    alphabetTransformation.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8 - 1] =
         alphabetTransformation.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[iVar7];
    alphabetTransformation.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[iVar7] = iVar2;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_448);
  std::vector<int,_std::allocator<int>_>::resize(clusters,text->_M_string_length);
  uVar3 = (uint)text->_M_string_length;
  pcVar4 = (text->_M_dataplus)._M_p;
  piVar6 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar10 = 0;
  uVar8 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar8 = uVar10;
  }
  while( true ) {
    if (uVar8 == uVar10) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&alphabetTransformation.super__Vector_base<int,_std::allocator<int>_>);
      return true;
    }
    if ((long)myCharToLetter._M_elems[pcVar4[uVar10]] < 1) break;
    iVar2 = alphabetTransformation.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(long)myCharToLetter._M_elems[pcVar4[uVar10]] + -1];
    piVar6[uVar10] = iVar2 + 1;
    if ((iVar2 < 0) || (uVar10 = uVar10 + 1, (int)uVar11 <= iVar2)) {
      __assert_fail("clusters[i] > 0 && clusters[i] <= k",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                    ,0x24b,
                    "bool Cipher::encryptExact(const TParameters &, const std::string &, TClusters &)"
                   );
    }
  }
  __assert_fail("myCharToLetter[text[i]] > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                ,0x249,
                "bool Cipher::encryptExact(const TParameters &, const std::string &, TClusters &)");
}

Assistant:

bool encryptExact(const TParameters & , const std::string & text, TClusters & clusters) {
        auto myCharToLetter = kCharToLetter;

		int k = 27;
        {
            for (auto & p : text) {
                if (myCharToLetter[p] == 0) {
                    myCharToLetter[p] = ++k;
                }
            }
            printf("[encryptExact] Unique symbols = %d\n", k);
        }

		std::vector<TClusterId> alphabetTransformation(k);
		for (int i = 0; i < (int) alphabetTransformation.size(); ++i) {
			alphabetTransformation[i] = i;
		}

		shuffle(alphabetTransformation);

		clusters.resize(text.size());

		for (int i = 0; i < (int) text.size(); ++i) {
			assert(myCharToLetter[text[i]] > 0);
			clusters[i] = alphabetTransformation[myCharToLetter[text[i]] - 1] + 1;
			assert(clusters[i] > 0 && clusters[i] <= k);
		}

        return true;
    }